

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O0

StringLiteral * __thiscall
StringLiteral::operator+
          (StringLiteral *__return_storage_ptr__,StringLiteral *this,StringLiteral *other)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  StringLiteral *local_20;
  StringLiteral *other_local;
  StringLiteral *this_local;
  
  local_20 = other;
  other_local = this;
  this_local = __return_storage_ptr__;
  std::operator+(&local_40,&this->_value,&other->_value);
  StringLiteral(__return_storage_ptr__,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

StringLiteral StringLiteral::operator+(const StringLiteral &other) const
{
	return StringLiteral(_value + other._value);
}